

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O1

void do_exits(CHAR_DATA *ch,char *argument)

{
  EXIT_DATA *pEVar1;
  ROOM_INDEX_DATA *pRVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  long lVar9;
  char *pcVar10;
  int door;
  long lVar11;
  char buf [4608];
  char local_1238 [4616];
  
  bVar3 = check_blind(ch);
  if (bVar3) {
    bVar3 = is_affected_room(ch->in_room,(int)gsn_smokescreen);
    if (bVar3) {
      pcVar6 = get_char_color(ch,"darkgrey");
      pcVar7 = END_COLOR(ch);
      sprintf(local_1238,"%sDense smoke prevents any vision beyond this room!%s\n\r",pcVar6,pcVar7);
      send_to_char(local_1238,ch);
    }
    bVar3 = str_cmp(argument,"auto");
    if (bVar3) {
      bVar4 = is_immortal(ch);
      if (bVar4) {
        sprintf(local_1238,"Obvious exits from room %d:\n\r",(ulong)(uint)(int)ch->in_room->vnum);
      }
      else {
        builtin_strncpy(local_1238,"Obvious exits:\n\r",0x11);
      }
    }
    else {
      builtin_strncpy(local_1238,"[Exits:",8);
    }
    bVar4 = false;
    lVar11 = 0;
    do {
      pEVar1 = ch->in_room->exit[lVar11];
      if ((pEVar1 != (EXIT_DATA *)0x0) && ((pEVar1->u1).to_room != (ROOM_INDEX_DATA *)0x0)) {
        bVar5 = can_see_room(ch,(pEVar1->u1).to_room);
        if (bVar5) {
          if ((pEVar1->exit_info[0] & 0x100) != 0) {
            bVar5 = is_immortal(ch);
            if (!bVar5) goto LAB_0024e092;
          }
          bVar5 = is_affected_room(ch->in_room,(int)gsn_smokescreen);
          if (!bVar5) {
            if (bVar3) {
              sVar8 = strlen(local_1238);
              pcVar7 = capitalize(dir_name[lVar11]);
              bVar4 = room_is_dark((pEVar1->u1).to_room);
              pcVar6 = "Too dark to tell";
              if (!bVar4) {
                pRVar2 = (pEVar1->u1).to_room;
                if (pRVar2->alt_description == (char *)0x0) {
                  lVar9 = 0x110;
                }
                else {
                  lVar9 = (ulong)(sun == 0 && pRVar2->alt_description_cond == 0) * 8 + 0x110;
                }
                pcVar6 = *(char **)((long)pRVar2->exit + lVar9 + -0x38);
              }
              sprintf(local_1238 + sVar8,"%-5s - %s",pcVar7,pcVar6);
              bVar4 = is_immortal(ch);
              sVar8 = strlen(local_1238);
              pcVar6 = local_1238 + sVar8;
              if (bVar4) {
                pcVar7 = "(CLOSED) ";
                if ((pEVar1->exit_info[0] & 2U) == 0) {
                  pcVar7 = "";
                }
                pcVar10 = "(NONOBVIOUS) ";
                if (((uint)pEVar1->exit_info[0] >> 8 & 1) == 0) {
                  pcVar10 = "";
                }
                sprintf(pcVar6," %s%s(room %d)\n\r",pcVar7,pcVar10,
                        (ulong)(uint)(int)((pEVar1->u1).to_room)->vnum);
              }
              else {
                local_1238[sVar8 + 2] = '\0';
                pcVar6[0] = '\n';
                pcVar6[1] = '\r';
              }
              bVar4 = true;
            }
            else {
              sVar8 = strlen(local_1238);
              (local_1238 + sVar8)[0] = ' ';
              (local_1238 + sVar8)[1] = '\0';
              if ((pEVar1->exit_info[0] & 0x102) != 0) {
                sVar8 = strlen(local_1238);
                (local_1238 + sVar8)[0] = '(';
                (local_1238 + sVar8)[1] = '\0';
              }
              strcat(local_1238,dir_name[lVar11]);
              bVar4 = true;
              if ((pEVar1->exit_info[0] & 0x102) != 0) {
                sVar8 = strlen(local_1238);
                (local_1238 + sVar8)[0] = ')';
                (local_1238 + sVar8)[1] = '\0';
              }
            }
          }
        }
      }
LAB_0024e092:
      lVar11 = lVar11 + 1;
    } while (lVar11 != 6);
    if (!bVar4) {
      pcVar6 = " none";
      if (bVar3) {
        pcVar6 = "None.\n\r";
      }
      strcat(local_1238,pcVar6);
    }
    if (!bVar3) {
      sVar8 = strlen(local_1238);
      builtin_strncpy(local_1238 + sVar8,"]\n\r",4);
    }
    send_to_char(local_1238,ch);
  }
  return;
}

Assistant:

void do_exits(CHAR_DATA *ch, char *argument)
{
	if (!check_blind(ch))
		return;

	char buf[MAX_STRING_LENGTH];
	if (is_affected_room(ch->in_room, gsn_smokescreen))
	{
		sprintf(buf, "%sDense smoke prevents any vision beyond this room!%s\n\r",
			get_char_color(ch, "darkgrey"),
			END_COLOR(ch));

		send_to_char(buf, ch);
	}

	auto fAuto = !str_cmp(argument, "auto");
	if (fAuto)
		sprintf(buf, "[Exits:");
	else if (is_immortal(ch))
		sprintf(buf, "Obvious exits from room %d:\n\r", ch->in_room->vnum);
	else
		sprintf(buf, "Obvious exits:\n\r");

	auto found = false;
	for (auto door = 0; door <= 5; door++)
	{
		auto pexit = ch->in_room->exit[door];

		if (pexit != nullptr
			&& pexit->u1.to_room != nullptr
			&& can_see_room(ch, pexit->u1.to_room)
			&& (!IS_SET(pexit->exit_info, EX_NONOBVIOUS) || is_immortal(ch))
			&& !is_affected_room(ch->in_room, gsn_smokescreen))
		{
			found = true;

			if (fAuto)
			{
				strcat(buf, " ");
				if (IS_SET(pexit->exit_info, EX_CLOSED) || IS_SET(pexit->exit_info, EX_NONOBVIOUS))
					strcat(buf, "(");

				strcat(buf, dir_name[door]);
				if (IS_SET(pexit->exit_info, EX_CLOSED) || IS_SET(pexit->exit_info, EX_NONOBVIOUS))
					strcat(buf, ")");
			}
			else
			{
				sprintf(buf + strlen(buf), "%-5s - %s",
					capitalize(dir_name[door]),
					room_is_dark(pexit->u1.to_room) ? "Too dark to tell" : get_room_name(pexit->u1.to_room));

				if (is_immortal(ch))
					sprintf(buf + strlen(buf), " %s%s(room %d)\n\r",
						IS_SET(pexit->exit_info, EX_CLOSED) ? "(CLOSED) " : "",
						IS_SET(pexit->exit_info, EX_NONOBVIOUS) ? "(NONOBVIOUS) " : "", pexit->u1.to_room->vnum);
				else
					sprintf(buf + strlen(buf), "\n\r");
			}
		}
	}

	if (!found)
		strcat(buf, fAuto ? " none" : "None.\n\r");

	if (fAuto)
		strcat(buf, "]\n\r");

	send_to_char(buf, ch);
}